

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrShort::emulate_mthd(MthdCelsiusVtxAttrShort *this)

{
  uint32_t uVar1;
  int local_14;
  int16_t v;
  int i;
  MthdCelsiusVtxAttrShort *this_local;
  
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      uVar1 = pgraph_idx_short_to_float
                        (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                         (int16_t)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                                   (0x30U - (char)(local_14 << 4) & 0x3f)) >> 0x30));
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [this->which * 4 + *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 +
       local_14] = uVar1;
    }
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [this->which * 4 + 2] = 0;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [this->which * 4 + 3] = 0x3f800000;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				int16_t v = extrs(val, i * 16, 16);
				exp.celsius_pipe_vtx[which * 4 + idx * 2 + i] = pgraph_idx_short_to_float(&exp, v);
			}
			if (idx == 0) {
				exp.celsius_pipe_vtx[which * 4 + 2] = 0;
				exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
			}
		}
	}